

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoLocator.cpp
# Opt level: O3

void __thiscall OpenMD::MoLocator::calcRef(MoLocator *this)

{
  double dVar1;
  RigidBodyStamp *pRVar2;
  pointer pcVar3;
  long lVar4;
  AtomStamp *pAVar5;
  _Alloc_hider _Var6;
  double dVar7;
  bool bVar8;
  uint i;
  ulong uVar9;
  uint i_3;
  pointer pVVar10;
  uint i_4;
  ulong uVar11;
  MoleculeStamp *pMVar12;
  pointer ppRVar13;
  long lVar14;
  pointer ppRVar15;
  long lVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  Vector<double,_3U> result;
  vector<double,_std::allocator<double>_> mass;
  RealType currAtomMass;
  RealType totMassInRb;
  Vector3d coor;
  string local_f8;
  void *local_d8;
  iterator iStack_d0;
  double *local_c8;
  pointer local_c0;
  pointer local_b8;
  RigidBodyStamp *local_b0;
  RealType local_a8;
  double local_a0;
  value_type local_98;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_80;
  double local_78 [4];
  pointer local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_d8 = (void *)0x0;
  iStack_d0._M_current = (double *)0x0;
  local_c8 = (double *)0x0;
  local_98.super_Vector<double,_3U>.data_[2] = 0.0;
  local_98.super_Vector<double,_3U>.data_[0] = 0.0;
  local_98.super_Vector<double,_3U>.data_[1] = 0.0;
  pMVar12 = this->myStamp;
  local_c0 = (pMVar12->rigidBodyStamps_).
             super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = (pMVar12->rigidBodyStamps_).
             super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  lVar14 = (long)(pMVar12->atomStamps_).
                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pMVar12->atomStamps_).
                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar14 != 0) {
    lVar14 = lVar14 >> 3;
    local_80 = &this->refCoords;
    ppRVar15 = (pointer)(lVar14 + (ulong)(lVar14 == 0));
    lVar14 = 0;
    ppRVar13 = (pointer)0x0;
    local_b8 = ppRVar15;
    do {
      pMVar12 = this->myStamp;
      pRVar2 = *(RigidBodyStamp **)
                ((long)(pMVar12->atomStamps_).
                       super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + (lVar14 >> 0x1d));
      if ((char)pRVar2[1].index_ == '\0') {
        pcVar3 = (pMVar12->Name).data_._M_dataplus._M_p;
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,pcVar3,pcVar3 + (pMVar12->Name).data_._M_string_length);
        _Var6._M_p = local_f8._M_dataplus._M_p;
        lVar16 = *(long *)&((_Rb_tree_header *)((long)&pRVar2[1].super_DataHolder.parameters_ + 8))
                           ->_M_header;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,lVar16,
                   (long)&(*(_Base_ptr *)((long)&pRVar2[1].super_DataHolder.parameters_ + 0x10))->
                          _M_color + lVar16);
        snprintf(painCave.errMsg,2000,
                 "MoLocator::calcRef error.\n\tComponent %s, atom %s does not have a position specified.\n\tThis means MoLocator cannot initalize it\'s position.\n"
                 ,_Var6._M_p,local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        painCave.isFatal = 1;
        simError();
        pMVar12 = this->myStamp;
        ppRVar15 = local_b8;
      }
      bVar8 = MoleculeStamp::isAtomInRigidBody(pMVar12,(int)ppRVar13);
      if (!bVar8) {
        lVar16 = *(long *)&((_Rb_tree_header *)((long)&pRVar2[1].super_DataHolder.parameters_ + 8))
                           ->_M_header;
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_b0 = pRVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,lVar16,
                   (long)&(*(_Base_ptr *)((long)&pRVar2[1].super_DataHolder.parameters_ + 0x10))->
                          _M_color + lVar16);
        local_a8 = getAtomMass(&local_f8,this->myFF);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (iStack_d0._M_current == local_c8) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_d8,iStack_d0,&local_a8);
        }
        else {
          *iStack_d0._M_current = local_a8;
          iStack_d0._M_current = iStack_d0._M_current + 1;
        }
        local_98.super_Vector<double,_3U>.data_[0] =
             *(double *)((long)&local_b0[1].super_DataHolder.parameters_ + 0x28);
        local_98.super_Vector<double,_3U>.data_[1] =
             *(double *)&local_b0[1].super_DataHolder.deprecatedKeywords_._M_t._M_impl;
        local_98.super_Vector<double,_3U>.data_[2] =
             *(double *)
              &((_Rb_tree_header *)((long)&local_b0[1].super_DataHolder.deprecatedKeywords_ + 8))->
               _M_header;
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                  (local_80,&local_98);
      }
      ppRVar13 = (pointer)((long)ppRVar13 + 1);
      lVar14 = lVar14 + 0x100000000;
    } while (ppRVar15 != ppRVar13);
  }
  if (local_c0 != local_58) {
    lVar14 = (long)local_c0 - (long)local_58 >> 3;
    local_c0 = (pointer)(lVar14 + (ulong)(lVar14 == 0));
    local_80 = &this->refCoords;
    ppRVar15 = (pointer)0x0;
    do {
      local_b0 = (this->myStamp->rigidBodyStamps_).
                 super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[(int)ppRVar15];
      local_98.super_Vector<double,_3U>.data_[2] = 0.0;
      local_98.super_Vector<double,_3U>.data_[0] = 0.0;
      local_98.super_Vector<double,_3U>.data_[1] = 0.0;
      local_a0 = 0.0;
      lVar14 = (long)*(pointer *)
                      ((long)&(local_b0->members_).super__Vector_base<int,_std::allocator<int>_> + 8
                      ) -
               *(long *)&(local_b0->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl;
      local_b8 = ppRVar15;
      if (lVar14 != 0) {
        lVar14 = lVar14 >> 2;
        lVar14 = lVar14 + (ulong)(lVar14 == 0);
        lVar16 = 0;
        do {
          lVar4 = *(long *)&(local_b0->members_).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl;
          if ((ulong)((long)*(pointer *)
                             ((long)&(local_b0->members_).
                                     super__Vector_base<int,_std::allocator<int>_> + 8) - lVar4 >> 2
                     ) <= (ulong)(lVar16 >> 0x20)) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          pAVar5 = (this->myStamp->atomStamps_).
                   super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*(int *)(lVar4 + (lVar16 >> 0x20) * 4)];
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          _Var6._M_p = (pAVar5->Type).data_._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,_Var6._M_p,
                     _Var6._M_p + *(size_type *)((long)&(pAVar5->Type).data_ + 8));
          local_a8 = getAtomMass(&local_f8,this->myFF);
          uVar17 = SUB84(local_a8,0);
          uVar18 = (undefined4)((ulong)local_a8 >> 0x20);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            uVar17 = SUB84(local_a8,0);
            uVar18 = (undefined4)((ulong)local_a8 >> 0x20);
          }
          local_a0 = local_a0 + (double)CONCAT44(uVar18,uVar17);
          local_98.super_Vector<double,_3U>.data_[0] =
               (double)CONCAT44(uVar18,uVar17) *
               (pAVar5->position_).super_Vector<double,_3U>.data_[0] +
               local_98.super_Vector<double,_3U>.data_[0];
          local_98.super_Vector<double,_3U>.data_[1] =
               (double)CONCAT44(uVar18,uVar17) *
               *(double *)((long)&(pAVar5->position_).super_Vector<double,_3U> + 8) +
               local_98.super_Vector<double,_3U>.data_[1];
          local_98.super_Vector<double,_3U>.data_[2] =
               (double)CONCAT44(uVar18,uVar17) *
               *(double *)((long)&(pAVar5->position_).super_Vector<double,_3U> + 0x10) +
               local_98.super_Vector<double,_3U>.data_[2];
          lVar16 = lVar16 + 0x100000000;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      if (iStack_d0._M_current == local_c8) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_d8,iStack_d0,&local_a0);
      }
      else {
        *iStack_d0._M_current = local_a0;
        iStack_d0._M_current = iStack_d0._M_current + 1;
      }
      ppRVar15 = local_b8;
      lVar14 = 0;
      do {
        local_98.super_Vector<double,_3U>.data_[lVar14] =
             local_98.super_Vector<double,_3U>.data_[lVar14] / local_a0;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                (local_80,&local_98);
      ppRVar15 = (pointer)((long)ppRVar15 + 1);
    } while (ppRVar15 != local_c0);
  }
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  uVar9 = (ulong)this->nIntegrableObjects;
  if (uVar9 == 0) {
    dVar7 = 0.0;
  }
  else {
    pVVar10 = (this->refCoords).
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    dVar7 = 0.0;
    uVar11 = 0;
    do {
      dVar1 = *(double *)((long)local_d8 + uVar11 * 8);
      local_f8._M_dataplus._M_p = (pointer)0x0;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_allocated_capacity = 0;
      lVar14 = 0;
      do {
        (&local_f8._M_dataplus)[lVar14]._M_p =
             (pointer)((pVVar10->super_Vector<double,_3U>).data_[lVar14] * dVar1);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      lVar14 = 0;
      do {
        local_78[lVar14] = (double)(&local_f8._M_dataplus)[lVar14]._M_p + local_78[lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      dVar7 = dVar7 + dVar1;
      uVar11 = uVar11 + 1;
      pVVar10 = pVVar10 + 1;
    } while (uVar11 != uVar9);
  }
  lVar14 = 0;
  do {
    local_78[lVar14] = local_78[lVar14] / dVar7;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  if (uVar9 != 0) {
    pVVar10 = (this->refCoords).
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      lVar14 = 0;
      do {
        (pVVar10->super_Vector<double,_3U>).data_[lVar14] =
             (pVVar10->super_Vector<double,_3U>).data_[lVar14] - local_78[lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      uVar11 = uVar11 + 1;
      pVVar10 = pVVar10 + 1;
    } while (uVar11 != uVar9);
  }
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  return;
}

Assistant:

void MoLocator::calcRef(void) {
    AtomStamp* currAtomStamp;
    RigidBodyStamp* rbStamp;
    std::vector<RealType> mass;
    Vector3d coor;
    Vector3d refMolCom;
    RealType totMassInRb;
    RealType currAtomMass;
    RealType molMass;

    std::size_t nAtoms       = myStamp->getNAtoms();
    std::size_t nRigidBodies = myStamp->getNRigidBodies();

    for (std::size_t i = 0; i < nAtoms; i++) {
      currAtomStamp = myStamp->getAtomStamp(i);

      if (!currAtomStamp->havePosition()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MoLocator::calcRef error.\n"
                 "\tComponent %s, atom %s does not have a position specified.\n"
                 "\tThis means MoLocator cannot initalize it's position.\n",
                 myStamp->getName().c_str(), currAtomStamp->getType().c_str());

        painCave.isFatal = 1;
        simError();
      }

      // if atom belongs to rigidbody, just skip it
      if (myStamp->isAtomInRigidBody(i)) continue;
      // get mass and the reference coordinate
      else {
        currAtomMass = getAtomMass(currAtomStamp->getType(), myFF);
        mass.push_back(currAtomMass);
        coor.x() = currAtomStamp->getPosX();
        coor.y() = currAtomStamp->getPosY();
        coor.z() = currAtomStamp->getPosZ();
        refCoords.push_back(coor);
      }
    }

    for (std::size_t i = 0; i < nRigidBodies; i++) {
      rbStamp                = myStamp->getRigidBodyStamp(i);
      std::size_t nAtomsInRb = rbStamp->getNMembers();

      coor.x()    = 0.0;
      coor.y()    = 0.0;
      coor.z()    = 0.0;
      totMassInRb = 0.0;

      for (std::size_t j = 0; j < nAtomsInRb; j++) {
        currAtomStamp = myStamp->getAtomStamp(rbStamp->getMemberAt(j));
        currAtomMass  = getAtomMass(currAtomStamp->getType(), myFF);
        totMassInRb += currAtomMass;

        coor.x() += currAtomStamp->getPosX() * currAtomMass;
        coor.y() += currAtomStamp->getPosY() * currAtomMass;
        coor.z() += currAtomStamp->getPosZ() * currAtomMass;
      }

      mass.push_back(totMassInRb);
      coor /= totMassInRb;
      refCoords.push_back(coor);
    }

    // calculate the reference center of mass
    molMass       = 0;
    refMolCom.x() = 0;
    refMolCom.y() = 0;
    refMolCom.z() = 0;

    for (std::size_t i = 0; i < nIntegrableObjects; i++) {
      refMolCom += refCoords[i] * mass[i];
      molMass += mass[i];
    }

    refMolCom /= molMass;

    // move the reference center of mass to (0,0,0) and adjust the
    // reference coordinate of the integrabel objects
    for (std::size_t i = 0; i < nIntegrableObjects; i++)
      refCoords[i] -= refMolCom;
  }